

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O0

void qsound_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  qsound_state *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset <= *(uint *)((long)info + 0x250)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x250) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x250) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0x248) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void qsound_write_rom(void *info, UINT32 offset, UINT32 length, const UINT8* data)
{
	qsound_state* chip = (qsound_state *)info;
	
	if (offset > chip->sample_rom_length)
		return;
	if (offset + length > chip->sample_rom_length)
		length = chip->sample_rom_length - offset;
	
	memcpy(chip->sample_rom + offset, data, length);
	
	return;
}